

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_peeling.cpp
# Opt level: O1

void __thiscall
spvtools::opt::LoopPeeling::GetIteratorUpdateOperations
          (LoopPeeling *this,Loop *loop,Instruction *iterator,
          unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
          *operations)

{
  IRContext *this_00;
  DefUseManager *pDVar1;
  pointer pOVar2;
  uint **ppuVar3;
  Instruction *pIVar4;
  bool bVar5;
  char cVar6;
  uint **ppuVar7;
  __hashtable *__h;
  pointer pOVar8;
  __node_gen_type __node_gen;
  Instruction *local_88;
  uint *local_80;
  unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
  *local_78;
  undefined8 uStack_70;
  code *local_68;
  code *pcStack_60;
  __uniq_ptr_data<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>,_true,_true>
  *local_58;
  size_type sStack_50;
  __node_base local_48;
  code *pcStack_40;
  
  this_00 = this->context_;
  local_88 = iterator;
  if ((this_00->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(this_00);
  }
  pDVar1 = (this_00->def_use_mgr_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
           .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
  local_78 = operations;
  std::
  _Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::
  _M_insert<spvtools::opt::Instruction*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spvtools::opt::Instruction*,false>>>>
            ((_Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)operations,&local_88,&local_78);
  pIVar4 = local_88;
  local_48._M_nxt = (_Hash_node_base *)0x0;
  pcStack_40 = (code *)0x0;
  local_58 = (__uniq_ptr_data<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>,_true,_true>
              *)0x0;
  sStack_50 = 0;
  local_58 = (__uniq_ptr_data<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>,_true,_true>
              *)operator_new(0x20);
  (local_58->
  super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
  )._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
  .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl = pDVar1;
  local_58[1].
  super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
  .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl =
       (DefUseManager *)loop;
  local_58[2].
  super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
  .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl =
       (DefUseManager *)operations;
  local_58[3].
  super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
  .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl =
       (DefUseManager *)this;
  pcStack_40 = std::
               _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_peeling.cpp:201:25)>
               ::_M_invoke;
  local_48._M_nxt =
       (_Hash_node_base *)
       std::
       _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_peeling.cpp:201:25)>
       ::_M_manager;
  uStack_70 = 0;
  pcStack_60 = std::
               _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h:830:17)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h:830:17)>
             ::_M_manager;
  pOVar8 = (pIVar4->operands_).
           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pOVar2 = (pIVar4->operands_).
           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_78 = (unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
              *)&local_58;
  if (pOVar8 != pOVar2) {
    do {
      bVar5 = spvIsInIdType(pOVar8->type);
      if (bVar5) {
        ppuVar3 = (uint **)(pOVar8->words).large_data_._M_t.
                           super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           .
                           super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                           ._M_head_impl;
        ppuVar7 = &(pOVar8->words).small_data_;
        if (ppuVar3 != (uint **)0x0) {
          ppuVar7 = ppuVar3;
        }
        local_80 = *ppuVar7;
        if (local_68 == (code *)0x0) {
          std::__throw_bad_function_call();
        }
        cVar6 = (*pcStack_60)(&local_78,&local_80);
        if (cVar6 == '\0') break;
      }
      pOVar8 = pOVar8 + 1;
    } while (pOVar8 != pOVar2);
  }
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,3);
  }
  if (local_48._M_nxt != (_Hash_node_base *)0x0) {
    (*(code *)local_48._M_nxt)(&local_58,&local_58,3);
  }
  return;
}

Assistant:

void LoopPeeling::GetIteratorUpdateOperations(
    const Loop* loop, Instruction* iterator,
    std::unordered_set<Instruction*>* operations) {
  analysis::DefUseManager* def_use_mgr = context_->get_def_use_mgr();
  operations->insert(iterator);
  iterator->ForEachInId([def_use_mgr, loop, operations, this](uint32_t* id) {
    Instruction* insn = def_use_mgr->GetDef(*id);
    if (insn->opcode() == spv::Op::OpLabel) {
      return;
    }
    if (operations->count(insn)) {
      return;
    }
    if (!loop->IsInsideLoop(insn)) {
      return;
    }
    GetIteratorUpdateOperations(loop, insn, operations);
  });
}